

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_error.cc
# Opt level: O2

void PF_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  
  if (rc - 1U < 9) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"PF warning: ");
    pcVar3 = _ZL10PF_WarnMsg_rel + *(int *)(_ZL10PF_WarnMsg_rel + (ulong)(rc - 1U) * 4);
  }
  else if ((uint)rc < 0xfffffff6) {
    if (rc == 0) {
      poVar1 = (ostream *)&std::cerr;
      pcVar3 = "PF_PrintError called with return code of 0\n";
      goto LAB_00117bcc;
    }
    if (rc != -0xb) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"PF error: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
      pcVar3 = " is out of bounds\n";
      goto LAB_00117bcc;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar1 = (ostream *)&std::cerr;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"PF error: ");
    pcVar3 = _ZL11PF_ErrorMsg_rel + *(int *)(_ZL11PF_ErrorMsg_rel + (ulong)(uint)~rc * 4);
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  pcVar3 = "\n";
LAB_00117bcc:
  std::operator<<(poVar1,pcVar3);
  return;
}

Assistant:

void PF_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_PF_WARN && rc <= PF_LASTWARN)
    // Print warning
    cerr << "PF warning: " << PF_WarnMsg[rc - START_PF_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_PF_ERR && -rc < -PF_LASTERROR)
    // Print error
    cerr << "PF error: " << PF_ErrorMsg[-rc + START_PF_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "PF_PrintError called with return code of 0\n";
  else
    cerr << "PF error: " << rc << " is out of bounds\n";
}